

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O3

bool __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::seek
          (basic_seq_coro_file<(coro_io::execution_type)1> *this,size_t offset,seekdir dir)

{
  char cVar1;
  long *plVar2;
  
  cVar1 = std::__basic_file<char>::is_open();
  if ((cVar1 != '\0') &&
     (plVar2 = (long *)std::istream::seekg((long)&this->frw_seq_file_,(_Ios_Seekdir)offset),
     (*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0)) {
    return true;
  }
  return false;
}

Assistant:

bool seek(size_t offset, std::ios_base::seekdir dir) {
#if defined(ENABLE_FILE_IO_URING) || defined(ASIO_WINDOWS)
    if (async_seq_file_ && async_seq_file_->is_open()) {
      int whence = SEEK_SET;
      if (dir == std::ios_base::cur)
        whence = SEEK_CUR;
      else if (dir == std::ios_base::end)
        whence = SEEK_END;

      std::error_code seek_ec;
      async_seq_file_->seek(
          offset, static_cast<asio::file_base::seek_basis>(whence), seek_ec);
      if (seek_ec) {
        return false;
      }
      return true;
    }
#endif
    if (frw_seq_file_.is_open()) {
      if (frw_seq_file_.seekg(offset, dir)) {
        return true;
      }
    }

    return false;
  }